

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O1

vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> * __thiscall
LargeGapGrayCode::getBinaryCode
          (vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> *__return_storage_ptr__,
          LargeGapGrayCode *this,int bitWidth)

{
  pointer *ppbVar1;
  int iVar2;
  iterator __position;
  pointer pbVar3;
  double dVar4;
  undefined8 uVar5;
  long lVar6;
  undefined1 auStack_48 [8];
  vector<int,_std::allocator<int>_> ts;
  bitset<20UL> bs;
  
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bitWidth < 0x15) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)auStack_48,
               (this->m_transitionSequences).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (long)bitWidth + -1);
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
  }
  ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  dVar4 = ldexp(1.0,bitWidth);
  if (0.0 < dVar4) {
    lVar6 = 0;
    do {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::bitset<20ul>,std::allocator<std::bitset<20ul>>>::
        _M_realloc_insert<std::bitset<20ul>const&>
                  ((vector<std::bitset<20ul>,std::allocator<std::bitset<20ul>>> *)
                   __return_storage_ptr__,__position,
                   (bitset<20UL> *)
                   &ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_end_of_storage);
      }
      else {
        ((__position._M_current)->super__Base_bitset<1UL>)._M_w =
             (_WordT)ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      iVar2 = *(int *)((long)auStack_48 + lVar6 * 4);
      if (0x13 < (ulong)(long)iVar2) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::flip",
                           (long)iVar2,0x14);
        pbVar3 = (__return_storage_ptr__->
                 super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if (pbVar3 != (pointer)0x0) {
          operator_delete(pbVar3);
        }
        _Unwind_Resume(uVar5);
      }
      ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((ulong)ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage ^ 1L << ((byte)iVar2 & 0x3f));
      lVar6 = lVar6 + 1;
      dVar4 = ldexp(1.0,bitWidth);
    } while ((double)(int)lVar6 < dVar4);
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::bitset<20> > LargeGapGrayCode::getBinaryCode(int bitWidth)
{
	std::vector<std::bitset<20> > binaryCode;

	std::vector<int> ts = getTransitionSequence(bitWidth);
	std::bitset<20> bs(0);

	for(int i = 0; i < pow(2, bitWidth); i++)
	{
		binaryCode.push_back(bs);
		bs.flip(ts[i]);
	}

	return binaryCode;
}